

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int CheckMode(int mb_x,int mb_y,int mode)

{
  int mode_local;
  int mb_y_local;
  int mb_x_local;
  int local_4;
  
  local_4 = mode;
  if (mode == 0) {
    if (mb_x == 0) {
      local_4 = 5;
      if (mb_y == 0) {
        local_4 = 6;
      }
    }
    else {
      local_4 = 0;
      if (mb_y == 0) {
        local_4 = 4;
      }
    }
  }
  return local_4;
}

Assistant:

static int CheckMode(int mb_x, int mb_y, int mode) {
  if (mode == B_DC_PRED) {
    if (mb_x == 0) {
      return (mb_y == 0) ? B_DC_PRED_NOTOPLEFT : B_DC_PRED_NOLEFT;
    } else {
      return (mb_y == 0) ? B_DC_PRED_NOTOP : B_DC_PRED;
    }
  }
  return mode;
}